

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void nghttp2_stream_dep_add(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  nghttp2_stream *dep_stream_local;
  
  dep_stream->sum_dep_weight = stream->weight + dep_stream->sum_dep_weight;
  if (dep_stream->dep_next == (nghttp2_stream *)0x0) {
    link_dep(dep_stream,stream);
  }
  else {
    insert_link_dep(dep_stream,stream);
  }
  validate_tree(stream);
  return;
}

Assistant:

void nghttp2_stream_dep_add(nghttp2_stream *dep_stream,
                            nghttp2_stream *stream) {
  DEBUGF("stream: dep_add dep_stream(%p)=%d, stream(%p)=%d\n", dep_stream,
         dep_stream->stream_id, stream, stream->stream_id);

  dep_stream->sum_dep_weight += stream->weight;

  if (dep_stream->dep_next == NULL) {
    link_dep(dep_stream, stream);
  } else {
    insert_link_dep(dep_stream, stream);
  }

  validate_tree(stream);
}